

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

TestObjectList * __thiscall
anon_unknown.dwarf_4eaaf::IntrusiveListTest::NewList
          (TestObjectList *__return_storage_ptr__,IntrusiveListTest *this,
          vector<int,_std::allocator<int>_> *data_values)

{
  bool bVar1;
  reference piVar2;
  int local_44;
  const_iterator cStack_40;
  int data_value;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *data_values_local;
  IntrusiveListTest *this_local;
  TestObjectList *result;
  
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::intrusive_list(__return_storage_ptr__);
  __end2 = std::vector<int,_std::allocator<int>_>::begin(data_values);
  cStack_40 = std::vector<int,_std::allocator<int>_>::end(data_values);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end2);
    local_44 = *piVar2;
    wabt::intrusive_list<(anonymous_namespace)::TestObject>::emplace_back<int&>
              (__return_storage_ptr__,&local_44);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

TestObjectList NewList(const std::vector<int>& data_values) {
    TestObjectList result;
    for (auto data_value : data_values)
      result.emplace_back(data_value);
    return result;
  }